

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O3

void SCurvePosCtrl_SetNewPos
               (SCurvePosCtrl_t *pSCurvePosCtrl,float cycle,float max_spd,float acc,float finish_pos
               )

{
  undefined4 uVar1;
  undefined4 uVar3;
  ulong uVar2;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  
  pSCurvePosCtrl->Time = 0.0;
  pSCurvePosCtrl->Cycle = cycle;
  pSCurvePosCtrl->Acc = acc;
  pSCurvePosCtrl->Dec = acc;
  pSCurvePosCtrl->MaxSpd = max_spd;
  pSCurvePosCtrl->OriginPos = pSCurvePosCtrl->Pos;
  pSCurvePosCtrl->FinishPos = finish_pos;
  pSCurvePosCtrl->DeltaPos = finish_pos - pSCurvePosCtrl->Pos;
  if (0.0001 < ABS(cycle)) {
    SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
    return;
  }
  fVar13 = pSCurvePosCtrl->MaxSpd;
  fVar5 = pSCurvePosCtrl->Spd;
  if (fVar13 <= fVar5) {
    if (fVar5 < fVar13) {
      return;
    }
    fVar7 = pSCurvePosCtrl->DeltaPos;
    fVar6 = (fVar5 * 0.5 * fVar5) / pSCurvePosCtrl->Acc;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 = fVar6;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1 =
         ((fVar13 * fVar13 - fVar5 * fVar5) * 0.5) / -pSCurvePosCtrl->Acc -
         (fVar13 * 0.5 * fVar13) / pSCurvePosCtrl->Dec;
    if (fVar7 <= fVar6) {
      if ((fVar6 < fVar7) || (fVar7 <= pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1)) {
        if (pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1 < fVar7) {
          return;
        }
        uVar4._0_4_ = pSCurvePosCtrl->Acc;
        uVar4._4_4_ = pSCurvePosCtrl->Dec;
        pSCurvePosCtrl->Acc = (float)(int)(uVar4 ^ 0x8000000080000000);
        pSCurvePosCtrl->Dec = (float)(int)((uVar4 ^ 0x8000000080000000) >> 0x20);
        fVar7 = -fVar13;
        pSCurvePosCtrl->MaxSpd = fVar7;
        fVar6 = (fVar7 - fVar5) / -(float)(undefined4)uVar4;
        pSCurvePosCtrl->AccTime = fVar6;
        pSCurvePosCtrl->DecTime = fVar13 / (float)uVar4._4_4_;
        fVar13 = (fVar13 * 0.5 * (fVar13 / (float)uVar4._4_4_) +
                 (fVar5 - fVar13) * -0.5 * fVar6 +
                 (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos)) / fVar7;
        goto LAB_0010bd3b;
      }
      uVar2._0_4_ = pSCurvePosCtrl->Acc;
      uVar2._4_4_ = pSCurvePosCtrl->Dec;
      pSCurvePosCtrl->Acc = (float)(int)(uVar2 ^ 0x8000000080000000);
      pSCurvePosCtrl->Dec = (float)(int)((uVar2 ^ 0x8000000080000000) >> 0x20);
      pSCurvePosCtrl->MaxSpd = -fVar13;
      fVar5 = (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos) *
              (float)(undefined4)uVar2 * -2.0 + fVar5 * fVar5;
      fVar13 = (float)uVar2._4_4_ * (float)uVar2._4_4_ +
               (float)(undefined4)uVar2 * (float)uVar2._4_4_;
      goto LAB_0010bd05;
    }
    fVar7 = pSCurvePosCtrl->Acc;
    pSCurvePosCtrl->Acc = -fVar7;
    fVar6 = (fVar13 - fVar5) / -fVar7;
    pSCurvePosCtrl->AccTime = fVar6;
    fVar7 = fVar13 / pSCurvePosCtrl->Dec;
    pSCurvePosCtrl->DecTime = fVar7;
    fVar5 = (fVar5 + fVar13) * -0.5 * fVar6 +
            (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos);
    fVar7 = fVar13 * -0.5 * fVar7;
  }
  else {
    fVar7 = (fVar13 * fVar13 - fVar5 * fVar5) * 0.5;
    uVar1 = pSCurvePosCtrl->Acc;
    uVar3 = pSCurvePosCtrl->Dec;
    auVar12._4_4_ = uVar3;
    auVar12._0_4_ = uVar1;
    auVar11._4_4_ = fVar13 * 0.5 * fVar13;
    auVar11._0_4_ = fVar7;
    auVar11._8_8_ = 0;
    auVar12._8_8_ = 0;
    auVar12 = divps(auVar11,auVar12);
    fVar10 = auVar12._0_4_ + auVar12._4_4_;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition0 = fVar10;
    fVar9 = (fVar5 * 0.5 * fVar5) / (float)uVar3;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition1 = fVar9;
    fVar6 = -(float)uVar1;
    fVar8 = fVar7 / fVar6 - auVar12._4_4_;
    pSCurvePosCtrl->DeltaPos_MaxSpdLimitedCondition2 = fVar8;
    fVar7 = pSCurvePosCtrl->DeltaPos;
    if (fVar7 <= fVar10) {
      if ((fVar10 < fVar7) || (fVar7 <= fVar9)) {
        if ((fVar9 < fVar7) || (fVar7 <= fVar8)) {
          if (fVar8 < fVar7) {
            return;
          }
          pSCurvePosCtrl->Acc = fVar6;
          pSCurvePosCtrl->Dec = -(float)uVar3;
          fVar7 = -fVar13;
          pSCurvePosCtrl->MaxSpd = fVar7;
          fVar6 = (fVar7 - fVar5) / fVar6;
          pSCurvePosCtrl->AccTime = fVar6;
          pSCurvePosCtrl->DecTime = fVar13 / (float)uVar3;
          fVar13 = (fVar13 * 0.5 * (fVar13 / (float)uVar3) +
                   (fVar5 - fVar13) * -0.5 * fVar6 +
                   (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos)) / fVar7;
          goto LAB_0010bd3b;
        }
        pSCurvePosCtrl->Acc = fVar6;
        uVar4 = CONCAT44(fVar13,uVar3) ^ 0x8000000080000000;
        pSCurvePosCtrl->Dec = (float)(int)uVar4;
        pSCurvePosCtrl->MaxSpd = (float)(int)(uVar4 >> 0x20);
        fVar13 = (float)uVar1 * -2.0;
      }
      else {
        fVar13 = (float)uVar1 + (float)uVar1;
      }
      fVar5 = (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos) * fVar13 + fVar5 * fVar5;
      fVar13 = (float)uVar3 * (float)uVar3 + (float)uVar1 * (float)uVar3;
LAB_0010bd05:
      fVar5 = fVar5 / fVar13;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      fVar13 = 0.0;
      pSCurvePosCtrl->DecTime = fVar5;
      pSCurvePosCtrl->AccTime =
           (fVar5 * pSCurvePosCtrl->Dec - pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc;
      goto LAB_0010bd3b;
    }
    fVar7 = (fVar13 - fVar5) / (float)uVar1;
    pSCurvePosCtrl->AccTime = fVar7;
    pSCurvePosCtrl->DecTime = fVar13 / (float)uVar3;
    fVar5 = (fVar5 + fVar13) * -0.5 * fVar7 +
            (pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos);
    fVar7 = fVar13 * -0.5 * (fVar13 / (float)uVar3);
  }
  fVar13 = (fVar7 + fVar5) / fVar13;
LAB_0010bd3b:
  pSCurvePosCtrl->MidTime = fVar13;
  return;
}

Assistant:

void SCurvePosCtrl_SetNewPos(SCurvePosCtrl_t *pSCurvePosCtrl, float cycle, float max_spd, float acc, float finish_pos)
{
	pSCurvePosCtrl->Time = 0.0f;
	pSCurvePosCtrl->Cycle = cycle;
	pSCurvePosCtrl->Acc = acc;
	pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->MaxSpd = max_spd;
	pSCurvePosCtrl->OriginPos = pSCurvePosCtrl->Pos;
	pSCurvePosCtrl->FinishPos = finish_pos;

	pSCurvePosCtrl->DeltaPos = pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos;

	if (fabs(pSCurvePosCtrl->Cycle) > SCURVE_EQUAL_ERROR)
	{
		SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
	}
	else
	{
		SCurvePosCtrl_MaxSpdLimited(pSCurvePosCtrl);
	}
}